

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node>
embree::SceneGraph::my_merge_quads_to_grids(Ref<embree::SceneGraph::Node> *node)

{
  BBox1f BVar1;
  bool bVar2;
  Ref<embree::SceneGraph::Node> *pRVar3;
  long *plVar4;
  reference pvVar5;
  _func_int **pp_Var6;
  size_type sVar7;
  reference pvVar8;
  undefined8 uVar9;
  uint *puVar10;
  undefined8 uVar11;
  Quad *pQVar12;
  long lVar13;
  deque<unsigned_int,_std::allocator<unsigned_int>_> *this;
  ulong uVar14;
  ulong uVar15;
  reference pvVar16;
  size_t sVar17;
  reference pvVar18;
  GridMeshNode *pGVar19;
  unsigned_long *puVar20;
  Vec3fa *pVVar21;
  long *in_RSI;
  Node *in_RDI;
  reference rVar22;
  size_t i_8;
  avector<Vec3fa> positions;
  size_t t;
  uint startVertex;
  bool extended_left;
  bool extended_bottom;
  bool extended_right;
  bool extended_top;
  uint height;
  uint width;
  deque<unsigned_int,_std::allocator<unsigned_int>_> bottom;
  deque<unsigned_int,_std::allocator<unsigned_int>_> top;
  deque<unsigned_int,_std::allocator<unsigned_int>_> right;
  deque<unsigned_int,_std::allocator<unsigned_int>_> left;
  uint edge;
  uint i_3;
  RTCGeometry geom;
  size_t i_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> faces;
  size_t i_1;
  vector<bool,_std::allocator<bool>_> visited;
  Ref<embree::SceneGraph::GridMeshNode> gmesh;
  Ref<embree::SceneGraph::QuadMeshNode> qmesh;
  size_t i;
  Ref<embree::SceneGraph::GroupNode> groupNode;
  Ref<embree::SceneGraph::MultiTransformNode> xfmNode_1;
  Ref<embree::SceneGraph::TransformNode> xfmNode;
  Vec3fa v;
  size_t i_13;
  size_t i_14;
  size_t i_7;
  size_t i_6;
  Vec3fa *old_items;
  size_t i_5;
  size_t i_4;
  size_t i_12;
  size_t i_11;
  Vec3fa *old_items_1;
  size_t i_10;
  size_t i_9;
  size_t new_size_alloced;
  size_t new_size_alloced_1;
  QuadMeshNode *this_00;
  value_type *__x;
  undefined4 uVar23;
  size_t in_stack_fffffffffffff3f8;
  allocator_type *in_stack_fffffffffffff400;
  avector<Vec3fa> *in_stack_fffffffffffff408;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffff410;
  size_t in_stack_fffffffffffff418;
  size_t in_stack_fffffffffffff420;
  avector<Vec3fa> *in_stack_fffffffffffff428;
  RTCGeometry in_stack_fffffffffffff430;
  deque<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffff440;
  size_t in_stack_fffffffffffff468;
  Ref<embree::SceneGraph::MaterialNode> *in_stack_fffffffffffff470;
  GridMeshNode *in_stack_fffffffffffff478;
  BBox1f in_stack_fffffffffffff480;
  GridMeshNode *in_stack_fffffffffffff488;
  GridMeshNode *in_stack_fffffffffffff490;
  RTCGeometry in_stack_fffffffffffff498;
  uint edgey;
  undefined1 *puVar24;
  undefined1 *puVar25;
  long *local_948;
  long *local_8d8;
  long *local_878;
  Ref<embree::SceneGraph::Node> *local_818;
  ulong local_7e8;
  undefined1 local_7e0 [8];
  ulong local_7d8;
  ulong local_7d0;
  void *local_7c8;
  ulong local_7c0;
  Grid local_7b4;
  uint local_7a8;
  undefined1 local_7a4;
  byte local_7a3;
  byte local_7a2;
  byte local_7a1;
  int local_7a0;
  int local_79c;
  undefined4 local_654;
  reference local_650;
  reference local_640;
  uint local_62c;
  undefined8 local_628;
  ulong local_620;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_610;
  reference local_5f8;
  ulong local_5e8;
  undefined1 local_5b1;
  long local_5b0;
  long *local_5a8;
  _func_int **local_5a0;
  long *local_598;
  Node *local_590;
  long *local_588;
  ulong local_580;
  long *local_578;
  long *local_570;
  long *local_568;
  long *local_560;
  Node *local_558;
  long *local_550 [3];
  undefined8 local_368;
  undefined8 uStack_360;
  RTCGeometry local_358;
  GridMeshNode *local_350;
  undefined1 *local_348;
  _func_int ***local_338;
  _func_int ***local_330;
  _func_int ***local_328;
  _func_int ***local_320;
  ulong local_310;
  undefined1 *local_308;
  long **local_2f8;
  long **local_2f0;
  long **local_2e8;
  long **local_2e0;
  long **local_2d8;
  long *local_2c8;
  long **local_2c0;
  long *local_2b8;
  long **local_2b0;
  long **local_2a8;
  long **local_298;
  reference local_290;
  long **local_288;
  long *local_280;
  long **local_278;
  Ref<embree::SceneGraph::Node> *local_270;
  _func_int **local_258;
  _func_int ***local_250;
  undefined8 *local_248;
  Vec3fa *local_240;
  RTCGeometry local_238;
  undefined8 *local_230;
  _func_int ***local_228;
  reference local_218;
  ulong local_210;
  undefined1 *local_208;
  _func_int **local_200;
  Ref<embree::SceneGraph::Node> *local_1f0;
  undefined1 *local_1e8;
  long *local_1e0;
  long **local_1d8;
  long *local_1d0;
  long **local_1c8;
  ulong local_1b0;
  undefined1 *local_1a8;
  ulong local_1a0;
  void *local_198;
  undefined1 *local_190;
  ulong local_170;
  ulong local_168;
  long local_160;
  ulong local_158;
  ulong local_148;
  ulong local_140;
  undefined1 *local_138;
  undefined8 *local_130;
  undefined8 *local_128;
  long local_120;
  void *local_118;
  ulong local_110;
  undefined1 *local_108;
  ulong local_100;
  long local_f8;
  undefined1 *local_f0;
  BBox1f local_e8;
  ulong local_e0;
  Vec3fa *local_d8;
  BBox1f local_d0;
  BBox1f local_c8;
  size_t local_c0;
  BBox1f local_b8;
  GridMeshNode *local_b0;
  Vec3fa *local_a8;
  Vec3fa *local_a0;
  Vec3fa *local_98;
  Vec3fa *local_90;
  size_t local_88;
  GridMeshNode *local_80;
  size_t local_78;
  Vec3fa *local_70;
  GridMeshNode *local_68;
  ulong local_48;
  undefined1 *local_40;
  ulong local_38;
  unsigned_long local_30 [2];
  ulong local_20;
  ulong local_18;
  GridMeshNode *local_10;
  size_t local_8;
  
  if (*in_RSI == 0) {
    local_818 = (Ref<embree::SceneGraph::Node> *)0x0;
  }
  else {
    local_818 = (Ref<embree::SceneGraph::Node> *)
                __dynamic_cast(*in_RSI,&Node::typeinfo,&TransformNode::typeinfo,0);
  }
  local_1e8 = &stack0xfffffffffffffac8;
  local_1f0 = local_818;
  if (local_818 != (Ref<embree::SceneGraph::Node> *)0x0) {
    (**(code **)&local_818->ptr->fileName)();
  }
  if (local_818 == (Ref<embree::SceneGraph::Node> *)0x0) {
    local_2f8 = &local_560;
    if (*in_RSI == 0) {
      local_878 = (long *)0x0;
    }
    else {
      local_878 = (long *)__dynamic_cast(*in_RSI,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
    }
    local_1c8 = &local_560;
    local_1d0 = local_878;
    local_560 = local_878;
    if (local_878 != (long *)0x0) {
      (**(code **)(*local_878 + 0x10))();
    }
    local_2f0 = &local_560;
    if (local_560 == (long *)0x0) {
      if (*in_RSI == 0) {
        local_8d8 = (long *)0x0;
      }
      else {
        local_8d8 = (long *)__dynamic_cast(*in_RSI,&Node::typeinfo,&GroupNode::typeinfo,0);
      }
      local_1d8 = &local_578;
      local_1e0 = local_8d8;
      local_578 = local_8d8;
      if (local_8d8 != (long *)0x0) {
        (**(code **)(*local_8d8 + 0x10))();
      }
      if (local_578 == (long *)0x0) {
        if (*in_RSI == 0) {
          local_948 = (long *)0x0;
        }
        else {
          local_948 = (long *)__dynamic_cast(*in_RSI,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
        }
        local_2b0 = &local_598;
        local_2b8 = local_948;
        local_598 = local_948;
        if (local_948 != (long *)0x0) {
          (**(code **)(*local_948 + 0x10))();
        }
        if (local_598 == (long *)0x0) {
          bVar2 = false;
        }
        else {
          pp_Var6 = (_func_int **)::operator_new(0xa8);
          local_5b1 = 1;
          local_2c8 = local_598 + 0x1a;
          local_2c0 = &local_5a8;
          local_5a8 = (long *)*local_2c8;
          if (local_5a8 != (long *)0x0) {
            (**(code **)(*local_5a8 + 0x10))();
          }
          local_5b0 = local_598[0xd];
          QuadMeshNode::numTimeSteps((QuadMeshNode *)0x1d9405);
          GridMeshNode::GridMeshNode
                    (in_stack_fffffffffffff478,in_stack_fffffffffffff470,in_stack_fffffffffffff480,
                     in_stack_fffffffffffff468);
          local_5b1 = 0;
          local_250 = &local_5a0;
          local_258 = pp_Var6;
          local_5a0 = pp_Var6;
          if (pp_Var6 != (_func_int **)0x0) {
            (**(code **)(*pp_Var6 + 0x10))();
          }
          local_2a8 = &local_5a8;
          if (local_5a8 != (long *)0x0) {
            (**(code **)(*local_5a8 + 0x18))();
          }
          std::vector<bool,_std::allocator<bool>_>::vector
                    ((vector<bool,_std::allocator<bool>_> *)0x1d94ed);
          (**(code **)(*local_598 + 0x70))();
          std::vector<bool,_std::allocator<bool>_>::resize
                    ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffff490,
                     (size_type)in_stack_fffffffffffff488,in_stack_fffffffffffff480.upper._3_1_);
          local_5e8 = 0;
          while( true ) {
            uVar14 = local_5e8;
            sVar7 = std::vector<bool,_std::allocator<bool>_>::size
                              ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffff430);
            if (sVar7 <= uVar14) break;
            rVar22 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (in_stack_fffffffffffff410,(size_type)in_stack_fffffffffffff408);
            local_5f8 = rVar22;
            std::_Bit_reference::operator=(&local_5f8,false);
            local_5e8 = local_5e8 + 1;
          }
          (**(code **)(*local_598 + 0x70))();
          std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x1d9705);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffff410,(size_type)in_stack_fffffffffffff408,
                     in_stack_fffffffffffff400);
          std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1d9731);
          local_620 = 0;
          while( true ) {
            uVar14 = local_620;
            sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_610);
            if (sVar7 <= uVar14) break;
            pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (&local_610,local_620);
            *pvVar8 = 4;
            local_620 = local_620 + 1;
          }
          uVar9 = rtcNewGeometry(g_device,8);
          local_628 = uVar9;
          puVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1d980c);
          uVar11 = (**(code **)(*local_598 + 0x70))();
          rtcSetSharedGeometryBuffer(uVar9,0x10,0,0x5001,puVar10,0,4,uVar11);
          uVar9 = local_628;
          pQVar12 = std::
                    vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                    ::data((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                            *)0x1d98d5);
          lVar13 = (**(code **)(*local_598 + 0x70))();
          this_00 = (QuadMeshNode *)0x4;
          rtcSetSharedGeometryBuffer(uVar9,0,0,0x5001,pQVar12,0,4,lVar13 << 2);
          uVar9 = local_628;
          local_218 = std::
                      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                      ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                    *)(local_598 + 0xe),0);
          pVVar21 = local_218->items;
          this = (deque<unsigned_int,_std::allocator<unsigned_int>_> *)
                 QuadMeshNode::numVertices(this_00);
          __x = (value_type *)0x10;
          rtcSetSharedGeometryBuffer(uVar9,1,0,0x9003,pVVar21,0);
          rtcCommitGeometry(local_628);
          local_62c = 0;
          while( true ) {
            uVar14 = (ulong)local_62c;
            uVar15 = (**(code **)(*local_598 + 0x70))();
            if (uVar15 <= uVar14) break;
            rVar22 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (in_stack_fffffffffffff410,(size_type)in_stack_fffffffffffff408);
            local_640 = rVar22;
            bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_640);
            if (!bVar2) {
              rVar22 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 (in_stack_fffffffffffff410,(size_type)in_stack_fffffffffffff408);
              local_650 = rVar22;
              std::_Bit_reference::operator=(&local_650,true);
              local_654 = rtcGetGeometryFirstHalfEdge(local_628,local_62c);
              std::deque<unsigned_int,_std::allocator<unsigned_int>_>::deque
                        ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)0x1d9bbd);
              std::deque<unsigned_int,_std::allocator<unsigned_int>_>::deque
                        ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)0x1d9bcc);
              std::deque<unsigned_int,_std::allocator<unsigned_int>_>::deque
                        ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)0x1d9bdb);
              std::deque<unsigned_int,_std::allocator<unsigned_int>_>::deque
                        ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)0x1d9bea);
              std::deque<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (this,&__x->startVtx);
              local_654 = rtcGetGeometryNextHalfEdge(local_628,local_654);
              std::deque<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (this,&__x->startVtx);
              local_654 = rtcGetGeometryNextHalfEdge(local_628,local_654);
              std::deque<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (this,&__x->startVtx);
              local_654 = rtcGetGeometryNextHalfEdge(local_628,local_654);
              std::deque<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (this,&__x->startVtx);
              local_654 = rtcGetGeometryNextHalfEdge(local_628,local_654);
              local_79c = 1;
              local_7a0 = 1;
              while( true ) {
                local_7a1 = extend_grid(in_stack_fffffffffffff498,
                                        (vector<bool,_std::allocator<bool>_> *)
                                        in_stack_fffffffffffff490,
                                        (deque<unsigned_int,_std::allocator<unsigned_int>_> *)
                                        in_stack_fffffffffffff488,
                                        (deque<unsigned_int,_std::allocator<unsigned_int>_> *)
                                        in_stack_fffffffffffff480,
                                        (deque<unsigned_int,_std::allocator<unsigned_int>_> *)
                                        in_stack_fffffffffffff478);
                local_7a2 = extend_grid(in_stack_fffffffffffff498,
                                        (vector<bool,_std::allocator<bool>_> *)
                                        in_stack_fffffffffffff490,
                                        (deque<unsigned_int,_std::allocator<unsigned_int>_> *)
                                        in_stack_fffffffffffff488,
                                        (deque<unsigned_int,_std::allocator<unsigned_int>_> *)
                                        in_stack_fffffffffffff480,
                                        (deque<unsigned_int,_std::allocator<unsigned_int>_> *)
                                        in_stack_fffffffffffff478);
                local_7a3 = extend_grid(in_stack_fffffffffffff498,
                                        (vector<bool,_std::allocator<bool>_> *)
                                        in_stack_fffffffffffff490,
                                        (deque<unsigned_int,_std::allocator<unsigned_int>_> *)
                                        in_stack_fffffffffffff488,
                                        (deque<unsigned_int,_std::allocator<unsigned_int>_> *)
                                        in_stack_fffffffffffff480,
                                        (deque<unsigned_int,_std::allocator<unsigned_int>_> *)
                                        in_stack_fffffffffffff478);
                local_7a4 = extend_grid(in_stack_fffffffffffff498,
                                        (vector<bool,_std::allocator<bool>_> *)
                                        in_stack_fffffffffffff490,
                                        (deque<unsigned_int,_std::allocator<unsigned_int>_> *)
                                        in_stack_fffffffffffff488,
                                        (deque<unsigned_int,_std::allocator<unsigned_int>_> *)
                                        in_stack_fffffffffffff480,
                                        (deque<unsigned_int,_std::allocator<unsigned_int>_> *)
                                        in_stack_fffffffffffff478);
                local_79c = (uint)(byte)local_7a4 + (uint)(local_7a2 & 1) + local_79c;
                local_7a0 = (uint)(local_7a1 & 1) + (uint)(local_7a3 & 1) + local_7a0;
                if (((((local_7a1 & 1) == 0) && ((local_7a2 & 1) == 0)) && ((local_7a3 & 1) == 0))
                   && (!(bool)local_7a4)) break;
                if ((0x7fff < local_79c + 2U) || (0x7fff < local_7a0 + 2U)) break;
              }
              local_328 = &local_5a0;
              pvVar16 = std::
                        vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                        ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                      *)(local_5a0 + 0xe),0);
              local_7a8 = (uint)pvVar16->size_active;
              local_330 = &local_5a0;
              GridMeshNode::Grid::Grid
                        (&local_7b4,local_7a8,local_79c + 1U,local_79c + 1U,local_7a0 + 1);
              std::
              vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
              ::push_back((vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
                           *)this,__x);
              local_7c0 = 0;
              while( true ) {
                uVar14 = local_7c0;
                sVar17 = QuadMeshNode::numTimeSteps((QuadMeshNode *)0x1da061);
                if (sVar17 <= uVar14) break;
                local_7d8 = 0;
                local_7d0 = 0;
                local_7c8 = (void *)0x0;
                local_210 = (ulong)(uint)((local_79c + 1) * (local_7a0 + 1));
                puVar25 = local_7e0;
                local_38 = local_210;
                if (local_210 == 0) {
                  local_38 = 0;
                }
                local_148 = local_38;
                local_7d8 = 0;
                local_208 = puVar25;
                local_140 = local_210;
                local_138 = puVar25;
                local_48 = local_210;
                local_40 = puVar25;
                if (local_38 == 0) {
                  for (local_158 = 0; local_158 < local_210; local_158 = local_158 + 1) {
                    local_120 = local_158 * 0x10;
                  }
                }
                else {
                  local_160 = 0;
                  local_110 = local_38;
                  puVar24 = puVar25;
                  local_108 = puVar25;
                  local_7c8 = alignedMalloc(in_stack_fffffffffffff3f8,(size_t)this);
                  for (local_168 = 0; local_168 < local_7d8; local_168 = local_168 + 1) {
                    local_128 = (undefined8 *)((long)local_7c8 + local_168 * 0x10);
                    local_130 = (undefined8 *)(local_160 + local_168 * 0x10);
                    uVar9 = local_130[1];
                    *local_128 = *local_130;
                    local_128[1] = uVar9;
                  }
                  for (local_170 = local_7d8; local_170 < local_140; local_170 = local_170 + 1) {
                    local_118 = (void *)((long)local_7c8 + local_170 * 0x10);
                  }
                  local_100 = local_7d0;
                  local_f8 = local_160;
                  local_f0 = puVar25;
                  alignedFree(__x);
                  local_7d0 = local_148;
                  puVar25 = puVar24;
                }
                edgey = (uint)puVar25;
                uVar23 = (undefined4)((ulong)__x >> 0x20);
                local_7d8 = local_140;
                std::
                vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                ::data((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                        *)0x1da52e);
                std::
                vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                              *)(local_598 + 0xe),local_7c0);
                pvVar18 = std::deque<unsigned_int,_std::allocator<unsigned_int>_>::front
                                    ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     in_stack_fffffffffffff400);
                __x = (value_type *)CONCAT44(uVar23,*pvVar18);
                gather_grid(in_stack_fffffffffffff430,in_stack_fffffffffffff428,
                            in_stack_fffffffffffff420,in_stack_fffffffffffff418,
                            (uint *)in_stack_fffffffffffff410,in_stack_fffffffffffff408,edgey);
                for (local_7e8 = 0; local_7e8 < local_7d8; local_7e8 = local_7e8 + 1) {
                  local_338 = &local_5a0;
                  pGVar19 = (GridMeshNode *)
                            std::
                            vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                            ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                          *)(local_5a0 + 0xe),local_7c0);
                  local_308 = local_7e0;
                  local_310 = local_7e8;
                  in_stack_fffffffffffff498 = (RTCGeometry)((long)local_7c8 + local_7e8 * 0x10);
                  local_230 = &local_368;
                  local_368 = *(undefined8 *)in_stack_fffffffffffff498;
                  uStack_360 = *(undefined8 *)(in_stack_fffffffffffff498 + 8);
                  in_stack_fffffffffffff480 =
                       (BBox1f)(pGVar19->super_Node).super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i;
                  local_18 = (pGVar19->super_Node).super_RefCount.refCounter.
                             super___atomic_base<unsigned_long>._M_i + 1;
                  in_stack_fffffffffffff488 = pGVar19;
                  in_stack_fffffffffffff490 = pGVar19;
                  local_358 = in_stack_fffffffffffff498;
                  local_350 = pGVar19;
                  local_238 = in_stack_fffffffffffff498;
                  local_10 = pGVar19;
                  if (*(ulong *)&(pGVar19->super_Node).fileName < local_18) {
                    sVar17 = local_18;
                    if (*(size_t *)&(pGVar19->super_Node).fileName != 0) {
                      local_20 = *(ulong *)&(pGVar19->super_Node).fileName;
                      while (local_20 < local_18) {
                        local_30[1] = 1;
                        local_30[0] = local_20 << 1;
                        puVar20 = std::max<unsigned_long>(local_30 + 1,local_30);
                        local_20 = *puVar20;
                      }
                      local_8 = local_20;
                      sVar17 = local_8;
                    }
                  }
                  else {
                    sVar17 = *(size_t *)&(pGVar19->super_Node).fileName;
                  }
                  local_8 = sVar17;
                  local_c0 = local_8;
                  BVar1 = in_stack_fffffffffffff480;
                  if ((ulong)in_stack_fffffffffffff480 <
                      (pGVar19->super_Node).super_RefCount.refCounter.
                      super___atomic_base<unsigned_long>._M_i) {
                    while (local_c8 = BVar1,
                          (ulong)local_c8 <
                          (pGVar19->super_Node).super_RefCount.refCounter.
                          super___atomic_base<unsigned_long>._M_i) {
                      BVar1 = (BBox1f)((long)local_c8 + 1);
                    }
                    (pGVar19->super_Node).super_RefCount.refCounter.
                    super___atomic_base<unsigned_long>._M_i = (__int_type)in_stack_fffffffffffff480;
                  }
                  in_stack_fffffffffffff478 = pGVar19;
                  local_b8 = in_stack_fffffffffffff480;
                  local_b0 = pGVar19;
                  if (local_8 == *(size_t *)&(pGVar19->super_Node).fileName) {
                    for (local_d0 = (BBox1f)(pGVar19->super_Node).super_RefCount.refCounter.
                                            super___atomic_base<unsigned_long>._M_i;
                        (ulong)local_d0 < (ulong)in_stack_fffffffffffff480;
                        local_d0 = (BBox1f)((long)local_d0 + 1)) {
                      local_98 = (Vec3fa *)(pGVar19->super_Node).fileName._M_string_length +
                                 (long)local_d0;
                    }
                    (pGVar19->super_Node).super_RefCount.refCounter.
                    super___atomic_base<unsigned_long>._M_i = (__int_type)in_stack_fffffffffffff480;
                  }
                  else {
                    local_d8 = (Vec3fa *)(pGVar19->super_Node).fileName._M_string_length;
                    local_88 = local_8;
                    local_80 = pGVar19;
                    pVVar21 = (Vec3fa *)alignedMalloc(in_stack_fffffffffffff3f8,(size_t)this);
                    (pGVar19->super_Node).fileName._M_string_length = (size_type)pVVar21;
                    for (local_e0 = 0;
                        local_e0 <
                        (pGVar19->super_Node).super_RefCount.refCounter.
                        super___atomic_base<unsigned_long>._M_i; local_e0 = local_e0 + 1) {
                      local_a0 = (Vec3fa *)(pGVar19->super_Node).fileName._M_string_length +
                                 local_e0;
                      local_a8 = local_d8 + local_e0;
                      uVar9 = *(undefined8 *)((long)&local_a8->field_0 + 8);
                      *(undefined8 *)&local_a0->field_0 = *(undefined8 *)&local_a8->field_0;
                      *(undefined8 *)((long)&local_a0->field_0 + 8) = uVar9;
                    }
                    for (local_e8 = (BBox1f)(pGVar19->super_Node).super_RefCount.refCounter.
                                            super___atomic_base<unsigned_long>._M_i;
                        (ulong)local_e8 < (ulong)local_b8; local_e8 = (BBox1f)((long)local_e8 + 1))
                    {
                      local_90 = (Vec3fa *)(pGVar19->super_Node).fileName._M_string_length +
                                 (long)local_e8;
                    }
                    local_78 = *(size_t *)&(pGVar19->super_Node).fileName;
                    local_70 = local_d8;
                    local_68 = pGVar19;
                    alignedFree(__x);
                    (pGVar19->super_Node).super_RefCount.refCounter.
                    super___atomic_base<unsigned_long>._M_i = (__int_type)local_b8;
                    *(size_t *)&(pGVar19->super_Node).fileName = local_c0;
                  }
                  local_240 = (Vec3fa *)
                              (in_stack_fffffffffffff478->super_Node).fileName._M_string_length;
                  sVar17 = (in_stack_fffffffffffff478->super_Node).super_RefCount.refCounter.
                           super___atomic_base<unsigned_long>._M_i;
                  (in_stack_fffffffffffff478->super_Node).super_RefCount.refCounter.
                  super___atomic_base<unsigned_long>._M_i = sVar17 + 1;
                  local_240 = local_240 + sVar17;
                  local_248 = &local_368;
                  *(undefined8 *)&local_240->field_0 = local_368;
                  *(undefined8 *)((long)&local_240->field_0 + 8) = uStack_360;
                }
                local_348 = local_7e0;
                for (local_1b0 = 0; local_1b0 < local_7d8; local_1b0 = local_1b0 + 1) {
                }
                local_1a0 = local_7d0;
                local_198 = local_7c8;
                local_1a8 = local_348;
                local_190 = local_348;
                alignedFree(__x);
                local_7c8 = (void *)0x0;
                local_7d0 = 0;
                local_7d8 = 0;
                local_7c0 = local_7c0 + 1;
              }
              std::deque<unsigned_int,_std::allocator<unsigned_int>_>::~deque
                        (in_stack_fffffffffffff440);
              std::deque<unsigned_int,_std::allocator<unsigned_int>_>::~deque
                        (in_stack_fffffffffffff440);
              std::deque<unsigned_int,_std::allocator<unsigned_int>_>::~deque
                        (in_stack_fffffffffffff440);
              std::deque<unsigned_int,_std::allocator<unsigned_int>_>::~deque
                        (in_stack_fffffffffffff440);
            }
            local_62c = local_62c + 1;
          }
          rtcReleaseGeometry(local_628);
          local_228 = &local_5a0;
          local_200 = local_5a0;
          (in_RDI->super_RefCount)._vptr_RefCount = local_5a0;
          if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
            (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
          }
          bVar2 = true;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffff400);
          std::vector<bool,_std::allocator<bool>_>::~vector
                    ((vector<bool,_std::allocator<bool>_> *)0x1dae1f);
          local_320 = &local_5a0;
          if (local_5a0 != (_func_int **)0x0) {
            (**(code **)(*local_5a0 + 0x18))();
          }
        }
        if (local_598 != (long *)0x0) {
          (**(code **)(*local_598 + 0x18))();
        }
        if (!bVar2) goto LAB_001daf59;
      }
      else {
        local_580 = 0;
        while( true ) {
          uVar14 = local_580;
          sVar7 = std::
                  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                  ::size((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                          *)(local_578 + 0xd));
          if (sVar7 <= uVar14) break;
          pvVar5 = std::
                   vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                   ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                 *)(local_578 + 0xd),local_580);
          local_590 = pvVar5->ptr;
          if (local_590 != (Node *)0x0) {
            (*(local_590->super_RefCount)._vptr_RefCount[2])();
          }
          my_merge_quads_to_grids(local_818);
          pvVar5 = std::
                   vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                   ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                 *)(local_578 + 0xd),local_580);
          local_298 = &local_588;
          local_290 = pvVar5;
          if (pvVar5->ptr != (Node *)0x0) {
            (*(pvVar5->ptr->super_RefCount)._vptr_RefCount[3])();
          }
          pvVar5->ptr = (Node *)*local_298;
          *local_298 = (long *)0x0;
          if (local_588 != (long *)0x0) {
            (**(code **)(*local_588 + 0x18))();
          }
          if (local_590 != (Node *)0x0) {
            (*(local_590->super_RefCount)._vptr_RefCount[3])();
          }
          local_580 = local_580 + 1;
        }
LAB_001daf59:
        bVar2 = false;
      }
      if (local_578 != (long *)0x0) {
        (**(code **)(*local_578 + 0x18))();
      }
      if (!bVar2) goto LAB_001daff5;
    }
    else {
      local_2e0 = &local_560;
      local_570 = (long *)local_560[0x10];
      if (local_570 != (long *)0x0) {
        (**(code **)(*local_570 + 0x10))();
      }
      my_merge_quads_to_grids(local_818);
      local_2e8 = &local_560;
      plVar4 = local_560 + 0x10;
      local_288 = &local_568;
      local_280 = plVar4;
      if (*plVar4 != 0) {
        (**(code **)(*(long *)*plVar4 + 0x18))();
      }
      *plVar4 = (long)*local_288;
      *local_288 = (long *)0x0;
      if (local_568 != (long *)0x0) {
        (**(code **)(*local_568 + 0x18))();
      }
      if (local_570 != (long *)0x0) {
        (**(code **)(*local_570 + 0x18))();
      }
LAB_001daff5:
      bVar2 = false;
    }
    local_2d8 = &local_560;
    if (local_560 != (long *)0x0) {
      (**(code **)(*local_560 + 0x18))();
    }
    if (bVar2) goto LAB_001db09f;
  }
  else {
    local_558 = local_818[0x13].ptr;
    if (local_558 != (Node *)0x0) {
      (*(local_558->super_RefCount)._vptr_RefCount[2])();
    }
    my_merge_quads_to_grids(local_818);
    pRVar3 = local_818 + 0x13;
    local_278 = local_550;
    local_270 = pRVar3;
    if (pRVar3->ptr != (Node *)0x0) {
      (*(pRVar3->ptr->super_RefCount)._vptr_RefCount[3])();
    }
    pRVar3->ptr = (Node *)*local_278;
    *local_278 = (long *)0x0;
    if (local_550[0] != (long *)0x0) {
      (**(code **)(*local_550[0] + 0x18))();
    }
    if (local_558 != (Node *)0x0) {
      (*(local_558->super_RefCount)._vptr_RefCount[3])();
    }
  }
  bVar2 = false;
LAB_001db09f:
  if (local_818 != (Ref<embree::SceneGraph::Node> *)0x0) {
    (*(code *)(local_818->ptr->fileName)._M_string_length)();
  }
  if (!bVar2) {
    (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)*in_RSI;
    *in_RSI = 0;
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::my_merge_quads_to_grids(Ref<SceneGraph::Node> node)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      xfmNode->child = my_merge_quads_to_grids(xfmNode->child);
    }
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      xfmNode->child = my_merge_quads_to_grids(xfmNode->child);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        groupNode->children[i] = my_merge_quads_to_grids(groupNode->children[i]);
    }
    else if (Ref<SceneGraph::QuadMeshNode> qmesh = node.dynamicCast<SceneGraph::QuadMeshNode>()) 
    {
      Ref<SceneGraph::GridMeshNode> gmesh = new SceneGraph::GridMeshNode(qmesh->material,qmesh->time_range,qmesh->numTimeSteps());
      
      std::vector<bool> visited;
      visited.resize(qmesh->numPrimitives());
      for (size_t i=0; i<visited.size(); i++) visited[i] = false;
      std::vector<unsigned int> faces(qmesh->numPrimitives());
      for (size_t i=0; i<faces.size(); i++) faces[i] = 4;

      /* create temporary subdiv mesh to get access to mesh topology */
      RTCGeometry geom = rtcNewGeometry(g_device,RTC_GEOMETRY_TYPE_SUBDIVISION);
      rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_FACE,   0, RTC_FORMAT_UINT,   faces.data(), 0, sizeof(unsigned int), qmesh->numPrimitives());
      rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_INDEX,  0, RTC_FORMAT_UINT,   qmesh->quads.data(), 0, sizeof(unsigned int), 4*qmesh->numPrimitives());
      rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_VERTEX, 0, RTC_FORMAT_FLOAT3, qmesh->positions[0].data(), 0, sizeof(Vec3fa), qmesh->numVertices());
      rtcCommitGeometry(geom);

      /* iterate over mesh and collect all grids */
      for (unsigned int i=0; i<qmesh->numPrimitives(); i++)
      {
        /* skip face if already added to some grid */
        if (visited[i]) continue;
        visited[i] = true;

        /* initialize grid with start quad */
        unsigned int edge = rtcGetGeometryFirstHalfEdge(geom,i);
        std::deque<unsigned int> left, right, top, bottom;
        left.push_back(edge);   edge = rtcGetGeometryNextHalfEdge(geom,edge);
        bottom.push_back(edge); edge = rtcGetGeometryNextHalfEdge(geom,edge);
        right.push_back(edge);  edge = rtcGetGeometryNextHalfEdge(geom,edge);
        top.push_back(edge);    edge = rtcGetGeometryNextHalfEdge(geom,edge);
        assert(edge == rtcGetGeometryFirstHalfEdge(geom,i));
        
        /* extend grid unless no longer possible */
        unsigned int width = 1;
        unsigned int height = 1;
        while (true)
        {
          const bool extended_top    = extend_grid(geom,visited,left,top,right);
          const bool extended_right  = extend_grid(geom,visited,top,right,bottom);
          const bool extended_bottom = extend_grid(geom,visited,right,bottom,left);
          const bool extended_left   = extend_grid(geom,visited,bottom,left,top);
          width  += extended_left + extended_right;
          height += extended_top  + extended_bottom;
          if (!extended_top && !extended_right && !extended_bottom && !extended_left) break;
          if (width+2  > SceneGraph::GridMeshNode::GRID_RES_MAX) break;
          if (height+2 > SceneGraph::GridMeshNode::GRID_RES_MAX) break;
        }
        
        /* add new grid to grid mesh */
        unsigned int startVertex = (unsigned int) gmesh->positions[0].size();
        gmesh->grids.push_back(SceneGraph::GridMeshNode::Grid(startVertex,width+1,width+1,height+1));

        /* gather all vertices of grid */
        for (size_t t=0; t<qmesh->numTimeSteps(); t++)
        {
          avector<Vec3fa> positions;
          positions.resize((width+1)*(height+1));
          gather_grid(geom,positions,width,height,(unsigned int*)qmesh->quads.data(), qmesh->positions[t], left.front());
          for (size_t i=0; i<positions.size(); i++)
            gmesh->positions[t].push_back(positions[i]);
        }
      }

      rtcReleaseGeometry(geom);

      return gmesh.dynamicCast<SceneGraph::Node>();
    }
    return node;
  }